

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.c
# Opt level: O3

void QuickSort(int *sort,int start,int end)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  if (start < end) {
    do {
      iVar1 = sort[start];
      uVar3 = (ulong)(uint)end;
      iVar2 = start;
      do {
        uVar3 = (ulong)(int)uVar3;
        do {
          if (sort[uVar3] < iVar1) {
            sort[iVar2] = sort[uVar3];
            iVar4 = iVar2 + 1;
            break;
          }
          uVar3 = uVar3 - 1;
          iVar4 = iVar2;
        } while ((long)iVar2 < (long)uVar3);
        iVar2 = (int)uVar3;
        if (iVar4 < iVar2) {
          lVar5 = 0;
          while (sort[iVar4 + lVar5] < iVar1) {
            lVar5 = lVar5 + 1;
            if ((long)iVar2 - (long)iVar4 == lVar5) goto LAB_001011b5;
          }
          sort[iVar2] = sort[iVar4 + lVar5];
          uVar3 = (ulong)(iVar2 - 1);
          iVar4 = iVar4 + (int)lVar5;
        }
        iVar2 = iVar4;
      } while (iVar2 < (int)uVar3);
LAB_001011b5:
      sort[iVar2] = iVar1;
      QuickSort(sort,start,iVar2 + -1);
      start = iVar2 + 1;
    } while (start < end);
  }
  return;
}

Assistant:

void QuickSort(int sort[],int start,int end){
    if(start >= end)
        return;
    int i = start;
    int j = end;
    int baseval = sort[start];
    while(i < j){
        //从右往左找比基准数小的数
        while(i < j && sort[j] >= baseval){
            j--;
        }
        if(i < j){      //交换
            sort[i] = sort[j];
            i++;        //减少一次寻找比基准数大的数
        }
        //从左往右找比基准数大的数
        while(i < j && sort[i] < baseval){
            i++;
        }
        if(i < j){      //交换
            sort[j] = sort[i];
            j--;    //减少一次寻找比基准数小的数
        }
    }
    //把基准数放到i的位置
    sort[i] = baseval;
    //递归
    QuickSort(sort,start,i - 1);  //快速排序基准数之前的
    QuickSort(sort,i + 1,end);    //快速排序基准数之后的
}